

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

FT_Error t1_allocate_blend(T1_Face face,FT_UInt num_designs,FT_UInt num_axis)

{
  FT_Pointer pvVar1;
  FT_Alloc_Func p_Var2;
  FT_Realloc_Func p_Var3;
  uint local_34;
  uint local_30;
  FT_UInt n;
  FT_UInt nn;
  FT_Error error;
  FT_Memory memory;
  PS_Blend blend;
  FT_UInt num_axis_local;
  FT_UInt num_designs_local;
  T1_Face face_local;
  
  _nn = (face->root).memory;
  n = 0;
  memory = (FT_Memory)face->blend;
  blend._0_4_ = num_axis;
  blend._4_4_ = num_designs;
  _num_axis_local = face;
  if ((PS_Blend)memory == (PS_Blend)0x0) {
    memory = (FT_Memory)ft_mem_alloc(_nn,0x300,(FT_Error *)&n);
    if (n != 0) {
      return n;
    }
    ((PS_Blend)memory)->num_default_design_vector = 0;
    _num_axis_local->blend = (PS_Blend)memory;
  }
  if (blend._4_4_ == 0) {
LAB_001bd431:
    if ((FT_UInt)blend != 0) {
      if ((*(int *)((long)&memory->user + 4) != 0) &&
         (*(FT_UInt *)((long)&memory->user + 4) != (FT_UInt)blend)) goto LAB_001bd511;
      *(FT_UInt *)((long)&memory->user + 4) = (FT_UInt)blend;
    }
    blend._4_4_ = *(uint *)&memory->user;
    blend._0_4_ = *(int *)((long)&memory->user + 4);
    if (((blend._4_4_ != 0) && ((FT_UInt)blend != 0)) && (memory[1].alloc == (FT_Alloc_Func)0x0)) {
      p_Var2 = (FT_Alloc_Func)
               ft_mem_realloc(_nn,8,0,(ulong)(blend._4_4_ * (FT_UInt)blend),(void *)0x0,
                              (FT_Error *)&n);
      memory[1].alloc = p_Var2;
      if (n == 0) {
        for (local_34 = 1; local_34 < blend._4_4_; local_34 = local_34 + 1) {
          (&memory[1].alloc)[local_34] = memory[1].alloc + (ulong)((FT_UInt)blend * local_34) * 8;
        }
      }
    }
  }
  else {
    if (*(int *)&memory->user == 0) {
      pvVar1 = ft_mem_realloc(_nn,0x38,0,(ulong)blend._4_4_,(void *)0x0,(FT_Error *)&n);
      memory[9].user = pvVar1;
      if (n != 0) {
        return n;
      }
      p_Var2 = (FT_Alloc_Func)
               ft_mem_realloc(_nn,0xe0,0,(ulong)blend._4_4_,(void *)0x0,(FT_Error *)&n);
      memory[0xd].alloc = p_Var2;
      if (n != 0) {
        return n;
      }
      p_Var3 = (FT_Realloc_Func)
               ft_mem_realloc(_nn,0x20,0,(ulong)blend._4_4_,(void *)0x0,(FT_Error *)&n);
      memory[0x11].realloc = p_Var3;
      if (n != 0) {
        return n;
      }
      p_Var2 = (FT_Alloc_Func)
               ft_mem_realloc(_nn,8,0,(ulong)(blend._4_4_ << 1),(void *)0x0,(FT_Error *)&n);
      memory[8].alloc = p_Var2;
      if (n != 0) {
        return n;
      }
      memory[8].free = (FT_Free_Func)(memory[8].alloc + (ulong)blend._4_4_ * 8);
      memory[8].realloc = (FT_Realloc_Func)&_num_axis_local->type1;
      memory[0xd].user = &(_num_axis_local->type1).private_dict;
      memory[0x11].free = (FT_Free_Func)&(_num_axis_local->type1).font_bbox;
      for (local_30 = 2; local_30 <= blend._4_4_; local_30 = local_30 + 1) {
        (&memory[8].realloc)[local_30] = (&memory[8].realloc)[local_30 - 1] + 0x38;
        (&memory[0xd].user)[local_30] = (void *)((long)(&memory[0xd].user)[local_30 - 1] + 0xe0);
        (&memory[0x11].free)[local_30] = (&memory[0x11].free)[local_30 - 1] + 0x20;
      }
      *(uint *)&memory->user = blend._4_4_;
      goto LAB_001bd431;
    }
    if (*(uint *)&memory->user == blend._4_4_) goto LAB_001bd431;
LAB_001bd511:
    n = 3;
  }
  return n;
}

Assistant:

static FT_Error
  t1_allocate_blend( T1_Face  face,
                     FT_UInt  num_designs,
                     FT_UInt  num_axis )
  {
    PS_Blend   blend;
    FT_Memory  memory = face->root.memory;
    FT_Error   error  = FT_Err_Ok;


    blend = face->blend;
    if ( !blend )
    {
      if ( FT_NEW( blend ) )
        goto Exit;

      blend->num_default_design_vector = 0;

      face->blend = blend;
    }

    /* allocate design data if needed */
    if ( num_designs > 0 )
    {
      if ( blend->num_designs == 0 )
      {
        FT_UInt  nn;


        /* allocate the blend `private' and `font_info' dictionaries */
        if ( FT_NEW_ARRAY( blend->font_infos[1], num_designs     ) ||
             FT_NEW_ARRAY( blend->privates  [1], num_designs     ) ||
             FT_NEW_ARRAY( blend->bboxes    [1], num_designs     ) ||
             FT_NEW_ARRAY( blend->weight_vector, num_designs * 2 ) )
          goto Exit;

        blend->default_weight_vector = blend->weight_vector + num_designs;

        blend->font_infos[0] = &face->type1.font_info;
        blend->privates  [0] = &face->type1.private_dict;
        blend->bboxes    [0] = &face->type1.font_bbox;

        for ( nn = 2; nn <= num_designs; nn++ )
        {
          blend->font_infos[nn] = blend->font_infos[nn - 1] + 1;
          blend->privates  [nn] = blend->privates  [nn - 1] + 1;
          blend->bboxes    [nn] = blend->bboxes    [nn - 1] + 1;
        }

        blend->num_designs = num_designs;
      }
      else if ( blend->num_designs != num_designs )
        goto Fail;
    }

    /* allocate axis data if needed */
    if ( num_axis > 0 )
    {
      if ( blend->num_axis != 0 && blend->num_axis != num_axis )
        goto Fail;

      blend->num_axis = num_axis;
    }

    /* allocate the blend design pos table if needed */
    num_designs = blend->num_designs;
    num_axis    = blend->num_axis;
    if ( num_designs && num_axis && blend->design_pos[0] == 0 )
    {
      FT_UInt  n;


      if ( FT_NEW_ARRAY( blend->design_pos[0], num_designs * num_axis ) )
        goto Exit;

      for ( n = 1; n < num_designs; n++ )
        blend->design_pos[n] = blend->design_pos[0] + num_axis * n;
    }

  Exit:
    return error;

  Fail:
    error = FT_THROW( Invalid_File_Format );
    goto Exit;
  }